

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::ConvertDescriptorToTypeTest_TestOneof_Test::TestBody
          (ConvertDescriptorToTypeTest_TestOneof_Test *this)

{
  bool bVar1;
  Descriptor *pDVar2;
  char *pcVar3;
  char *pcVar4;
  Descriptor *in_R8;
  string_view url_prefix;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  int in_stack_fffffffffffffc38;
  string local_3b0;
  AssertHelper local_390;
  Message local_388;
  string_view local_380;
  string_view local_370;
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_328;
  Message local_320;
  string_view local_318;
  string_view local_308;
  bool local_2f1;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_2c0;
  Message local_2b8;
  string_view local_2b0;
  string_view local_2a0;
  bool local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_258;
  Message local_250;
  string_view local_248;
  string_view local_238;
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1f0;
  Message local_1e8;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_198;
  Message local_190;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_140;
  Message local_138;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_e8;
  Message local_e0 [3];
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  size_t local_98;
  undefined1 local_90 [8];
  Type type;
  ConvertDescriptorToTypeTest_TestOneof_Test *this_local;
  
  type.field_0._104_8_ = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,
             "type.googleapis.com");
  pDVar2 = proto2_unittest::TestAllTypes::GetDescriptor();
  url_prefix._M_str = (char *)pDVar2;
  url_prefix._M_len = local_98;
  ConvertDescriptorToType
            ((Type *)local_90,
             (util *)gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,url_prefix,in_R8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"oneof_uint32")
  ;
  name._M_str = (char *)0x6f;
  name._M_len = (size_t)local_c8._M_str;
  pcVar3 = (char *)0x6f;
  local_b1 = HasField((anon_unknown_0 *)local_90,(Type *)0x1,0xd,(Kind)local_c8._M_len,name,
                      in_stack_fffffffffffffc38);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_b0,
               (AssertionResult *)
               "HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_UINT32, \"oneof_uint32\", 111)"
               ,"false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x2b5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e8,local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_130,"oneof_nested_message");
  name_00._M_str = (char *)0x70;
  name_00._M_len = (size_t)local_130._M_str;
  pcVar3 = (char *)0x70;
  local_119 = HasField((anon_unknown_0 *)local_90,(Type *)0x1,0xb,(Kind)local_130._M_len,name_00,
                       in_stack_fffffffffffffc38);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_118,
               (AssertionResult *)
               "HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_MESSAGE, \"oneof_nested_message\", 112)"
               ,"false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x2b7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_188,"oneof_string");
  name_01._M_str = (char *)0x71;
  name_01._M_len = (size_t)local_188._M_str;
  pcVar3 = (char *)0x71;
  local_171 = HasField((anon_unknown_0 *)local_90,(Type *)0x1,9,(Kind)local_188._M_len,name_01,
                       in_stack_fffffffffffffc38);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_170,&local_171,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_170,
               (AssertionResult *)
               "HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_STRING, \"oneof_string\", 113)"
               ,"false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x2b9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e0,"oneof_bytes")
  ;
  name_02._M_str = (char *)0x72;
  name_02._M_len = (size_t)local_1e0._M_str;
  pcVar3 = (char *)0x72;
  local_1c9 = HasField((anon_unknown_0 *)local_90,(Type *)0x1,0xc,(Kind)local_1e0._M_len,name_02,
                       in_stack_fffffffffffffc38);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_1c8,
               (AssertionResult *)
               "HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_BYTES, \"oneof_bytes\", 114)"
               ,"false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,699,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_238,"oneof_uint32");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,"oneof_field")
  ;
  local_221 = FieldInOneof((Type *)local_90,local_238,local_248);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_220,&local_221,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_220,
               (AssertionResult *)"FieldInOneof(type, \"oneof_uint32\", \"oneof_field\")","false",
               "true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,700,pcVar4);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2a0,"oneof_nested_message");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2b0,"oneof_field")
  ;
  local_289 = FieldInOneof((Type *)local_90,local_2a0,local_2b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_288,&local_289,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_288,
               (AssertionResult *)"FieldInOneof(type, \"oneof_nested_message\", \"oneof_field\")",
               "false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x2bd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_308,"oneof_string");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_318,"oneof_field")
  ;
  local_2f1 = FieldInOneof((Type *)local_90,local_308,local_318);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f0,&local_2f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_2f0,
               (AssertionResult *)"FieldInOneof(type, \"oneof_string\", \"oneof_field\")","false",
               "true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x2be,pcVar4);
    testing::internal::AssertHelper::operator=(&local_328,&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_370,"oneof_bytes")
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_380,"oneof_field")
  ;
  local_359 = FieldInOneof((Type *)local_90,local_370,local_380);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_358,&local_359,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3b0,(internal *)local_358,
               (AssertionResult *)"FieldInOneof(type, \"oneof_bytes\", \"oneof_field\")","false",
               "true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x2bf,pcVar3);
    testing::internal::AssertHelper::operator=(&local_390,&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  Type::~Type((Type *)local_90);
  return;
}

Assistant:

TEST(ConvertDescriptorToTypeTest, TestOneof) {
  Type type = ConvertDescriptorToType(
      kUrlPrefix, *proto2_unittest::TestAllTypes::GetDescriptor());
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_UINT32,
                       "oneof_uint32", 111));
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_MESSAGE,
                       "oneof_nested_message", 112));
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_STRING,
                       "oneof_string", 113));
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_BYTES,
                       "oneof_bytes", 114));
  EXPECT_TRUE(FieldInOneof(type, "oneof_uint32", "oneof_field"));
  EXPECT_TRUE(FieldInOneof(type, "oneof_nested_message", "oneof_field"));
  EXPECT_TRUE(FieldInOneof(type, "oneof_string", "oneof_field"));
  EXPECT_TRUE(FieldInOneof(type, "oneof_bytes", "oneof_field"));
}